

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall CommandDrawInventoryBar::~CommandDrawInventoryBar(CommandDrawInventoryBar *this)

{
  uint local_14;
  uint i;
  CommandDrawInventoryBar *this_local;
  
  (this->super_SBarInfoCommand)._vptr_SBarInfoCommand =
       (_func_int **)&PTR__CommandDrawInventoryBar_00b864a0;
  if (this->counters != (CommandDrawNumber **)0x0) {
    for (local_14 = 0; local_14 < this->size; local_14 = local_14 + 1) {
      if (this->counters[local_14] != (CommandDrawNumber *)0x0) {
        (*(this->counters[local_14]->super_CommandDrawString).super_SBarInfoCommand.
          _vptr_SBarInfoCommand[1])();
      }
    }
    if (this->counters != (CommandDrawNumber **)0x0) {
      operator_delete__(this->counters);
    }
  }
  SBarInfoCommand::~SBarInfoCommand(&this->super_SBarInfoCommand);
  return;
}

Assistant:

~CommandDrawInventoryBar()
		{
			if(counters != NULL)
			{
				for(unsigned int i = 0;i < size;i++)
					delete counters[i];
				delete[] counters;
			}
		}